

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::cftf162(double *a,double *w)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  ulong uVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dStack_1d0;
  double dStack_d0;
  double dStack_a0;
  double dStack_20;
  
  uVar43 = (ulong)DAT_001262d0;
  dVar7 = a[8] - a[0x19];
  dVar11 = a[9] + a[0x18];
  dVar23 = a[8] + a[0x19];
  dVar28 = a[9] - a[0x18];
  dVar1 = w[5];
  dVar37 = w[4];
  dVar29 = a[1] + a[0x10];
  dVar32 = *a + a[0x11];
  dVar24 = a[1] - a[0x10];
  dVar26 = *a - a[0x11];
  dVar40 = dVar7 + dVar11;
  dVar7 = dVar7 - dVar11;
  auVar2._8_4_ = SUB84(dVar7,0);
  auVar2._0_8_ = dVar40;
  auVar2._12_4_ = (int)((ulong)dVar7 >> 0x20);
  dVar11 = a[2] - a[0x13];
  dVar15 = a[3] - a[0x12];
  dVar8 = a[0x13] + a[2];
  dVar7 = a[0x12] + a[3];
  dVar25 = dVar11 * dVar37 + (double)((ulong)dVar1 ^ uVar43) * dVar7;
  dVar27 = dVar7 * dVar37 + dVar1 * dVar11;
  dVar19 = a[10] - a[0x1b];
  dVar21 = a[0xb] - a[0x1a];
  dVar12 = a[0x1b] + a[10];
  dVar16 = a[0x1a] + a[0xb];
  dVar7 = w[7];
  dVar11 = w[6];
  dVar20 = dVar16 * (double)((ulong)dVar11 ^ uVar43) - dVar7 * dVar19;
  dVar22 = dVar19 * dVar11 - dVar7 * dVar16;
  dVar35 = a[5] + a[0x14];
  dVar36 = a[4] + a[0x15];
  dVar30 = a[5] - a[0x14];
  dVar33 = a[4] - a[0x15];
  dVar16 = w[9];
  dVar19 = w[8];
  auVar3._8_4_ = SUB84(dVar19,0);
  auVar3._0_8_ = dVar19;
  auVar3._12_4_ = (int)((ulong)dVar19 >> 0x20);
  dVar31 = dVar35 * dVar19 + dVar33 * dVar16;
  dVar34 = dVar33 * dVar19 + dVar35 * (double)((ulong)dVar16 ^ uVar43);
  dVar33 = a[0xd] + a[0x1c];
  dVar35 = a[0xc] + a[0x1d];
  auVar4._8_4_ = SUB84(dVar35,0);
  auVar4._0_8_ = dVar33;
  auVar4._12_4_ = (int)((ulong)dVar35 >> 0x20);
  dVar13 = a[0xd] - a[0x1c];
  dVar35 = a[0xc] - a[0x1d];
  dVar14 = dVar33 * dVar16 + dVar35 * dVar19;
  dVar17 = dVar35 * dVar16 + dVar33 * (double)((ulong)dVar19 ^ uVar43);
  dVar33 = a[6] - a[0x17];
  dVar18 = a[7] - a[0x16];
  dVar51 = a[0x17] + a[6];
  dVar35 = a[0x16] + a[7];
  dVar45 = (double)((ulong)dVar7 ^ uVar43);
  dVar39 = dVar33 * dVar11 + dVar35 * dVar7;
  dVar41 = dVar35 * dVar11 + dVar33 * dVar45;
  dVar9 = a[0xe] - a[0x1f];
  dVar10 = a[0xf] - a[0x1e];
  dVar33 = a[0x1f] + a[0xe];
  dVar35 = a[0x1e] + a[0xf];
  dVar46 = dVar9 * dVar1 + (double)(uVar43 ^ (ulong)dVar37) * dVar35;
  dVar35 = dVar35 * dVar1 + dVar37 * dVar9;
  dVar47 = dVar27 - dVar22;
  dVar50 = dVar39 - dVar46;
  dVar42 = dVar25 + dVar20;
  dVar27 = dVar27 + dVar22;
  dVar39 = dVar39 + dVar46;
  dVar46 = dVar41 + dVar35;
  dVar25 = dVar25 - dVar20;
  dVar41 = dVar41 - dVar35;
  dVar22 = dVar25 - dVar41;
  dVar41 = dVar41 + dVar25;
  dVar48 = dVar47 - dVar50;
  dVar9 = dVar8 * dVar11 + dVar15 * dVar7;
  dVar8 = dVar15 * dVar11 + dVar8 * dVar45;
  dVar25 = dVar12 * dVar37 + dVar21 * dVar1;
  dVar21 = dVar21 * dVar37 + dVar12 * (double)((ulong)dVar1 ^ uVar43);
  dVar12 = dVar51 * dVar1 + dVar18 * dVar37;
  dVar20 = dVar18 * dVar1 + dVar51 * (double)(uVar43 ^ (ulong)dVar37);
  dVar37 = dVar45 * dVar33 + dVar10 * (double)((ulong)dVar11 ^ uVar43);
  dVar7 = dVar45 * dVar10 + dVar33 * dVar11;
  auVar5._8_4_ = SUB84(dVar7,0);
  auVar5._0_8_ = dVar37;
  auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
  dVar11 = dVar9 - dVar25;
  dVar35 = dVar8 - dVar21;
  dVar25 = dVar25 + dVar9;
  dVar21 = dVar21 + dVar8;
  dVar15 = dVar12 - dVar37;
  dVar7 = dVar20 - dVar7;
  dVar9 = dVar25 - dVar7;
  dVar10 = dVar21 - dVar15;
  dVar7 = dVar7 + dVar25;
  dVar15 = dVar15 + dVar21;
  dVar1 = w[1];
  dVar33 = (dVar41 - dVar48) * dVar1;
  dVar49 = (dVar48 + dVar41) * dVar1;
  dVar18 = (dVar7 - dVar10) * dVar1;
  dVar44 = (dVar9 - dVar15) * dVar1;
  dStack_20 = auVar2._8_8_;
  dVar40 = dVar40 * dVar1;
  dVar8 = dVar29 + dVar40;
  dVar41 = dVar26 + dStack_20 * dVar1;
  dVar21 = dVar31 + dVar14;
  dVar25 = dVar34 + dVar17;
  dVar51 = dVar8 + dVar21;
  dVar38 = dVar41 + dVar25;
  dVar45 = dVar42 + dVar39;
  dVar48 = dVar27 + dVar46;
  a[2] = dVar38 - dVar45;
  a[3] = dVar51 - dVar48;
  *a = dVar38 + dVar45;
  a[1] = dVar51 + dVar48;
  dVar8 = dVar8 - dVar21;
  dVar41 = dVar41 - dVar25;
  dVar42 = dVar42 - dVar39;
  dVar27 = dVar27 - dVar46;
  a[4] = dVar41 - dVar27;
  a[5] = dVar42 + dVar8;
  a[6] = dVar27 + dVar41;
  a[7] = dVar8 - dVar42;
  dVar47 = dVar47 + dVar50;
  dVar29 = dVar29 - dVar40;
  dVar26 = dVar26 - dStack_20 * dVar1;
  dVar31 = dVar31 - dVar14;
  dVar34 = dVar34 - dVar17;
  dVar40 = dVar26 - dVar31;
  dVar8 = dVar29 - dVar34;
  dVar31 = dVar31 + dVar26;
  dVar34 = dVar34 + dVar29;
  dVar14 = (dVar22 - dVar47) * dVar1;
  dVar17 = (dVar47 + dVar22) * dVar1;
  a[8] = dVar40 + dVar14;
  a[9] = dVar34 + dVar17;
  a[10] = dVar40 - dVar14;
  a[0xb] = dVar34 - dVar17;
  a[0xc] = dVar31 - dVar49;
  a[0xd] = dVar8 + dVar33;
  a[0xe] = dVar49 + dVar31;
  a[0xf] = dVar8 - dVar33;
  dVar40 = (dVar23 + dVar28) * dVar1;
  dVar8 = (dVar23 - dVar28) * dVar1;
  dVar33 = dVar32 - dVar40;
  dVar14 = dVar24 - dVar8;
  dVar32 = dVar32 + dVar40;
  dVar24 = dVar24 + dVar8;
  dVar8 = dVar36 * dVar16 + (double)((ulong)dVar19 ^ uVar43) * dVar30;
  dVar17 = dVar30 * dVar16 + dVar19 * dVar36;
  dStack_d0 = auVar4._8_8_;
  dStack_a0 = auVar3._8_8_;
  dVar19 = dStack_d0 * dVar19 + (double)((ulong)dVar16 ^ uVar43) * dVar13;
  dVar40 = dVar13 * dStack_a0 + dVar16 * dStack_d0;
  dVar16 = dVar8 - dVar19;
  dVar13 = dVar17 - dVar40;
  dVar12 = dVar12 + dVar37;
  dStack_1d0 = auVar5._8_8_;
  dVar20 = dVar20 + dStack_1d0;
  dVar37 = dVar33 + dVar16;
  dVar41 = dVar24 + dVar13;
  dVar21 = dVar11 - dVar12;
  dVar22 = dVar35 - dVar20;
  a[0x10] = dVar37 + dVar21;
  a[0x11] = dVar41 + dVar22;
  a[0x12] = dVar37 - dVar21;
  a[0x13] = dVar41 - dVar22;
  dVar33 = dVar33 - dVar16;
  dVar24 = dVar24 - dVar13;
  dVar12 = dVar12 + dVar11;
  dVar20 = dVar20 + dVar35;
  a[0x14] = dVar33 - dVar20;
  a[0x15] = dVar12 + dVar24;
  a[0x16] = dVar20 + dVar33;
  a[0x17] = dVar24 - dVar12;
  dVar19 = dVar19 + dVar8;
  dVar40 = dVar40 + dVar17;
  dVar11 = dVar14 - dVar19;
  dVar16 = dVar32 - dVar40;
  a[0x18] = dVar16 + dVar18;
  dVar19 = dVar19 + dVar14;
  dVar40 = dVar40 + dVar32;
  dVar37 = (dVar7 + dVar10) * dVar1;
  dVar1 = (dVar15 + dVar9) * dVar1;
  a[0x19] = dVar19 + dVar37;
  a[0x1a] = dVar16 - dVar18;
  a[0x1b] = dVar19 - dVar37;
  a[0x1c] = dVar40 - dVar1;
  dVar1 = dVar1 + dVar40;
  auVar6._8_4_ = SUB84(dVar1,0);
  auVar6._0_8_ = dVar44 + dVar11;
  auVar6._12_4_ = (int)((ulong)dVar1 >> 0x20);
  *(undefined1 (*) [16])(a + 0x1d) = auVar6;
  a[0x1f] = dVar11 - dVar44;
  return;
}

Assistant:

void cftf162(double *a, double *w) {
  double wn4r, wk1r, wk1i, wk2r, wk2i, wk3r, wk3i,
    x0r, x0i, x1r, x1i, x2r, x2i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
    y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i,
    y8r, y8i, y9r, y9i, y10r, y10i, y11r, y11i,
    y12r, y12i, y13r, y13i, y14r, y14i, y15r, y15i;

  wn4r = w[1];
  wk1r = w[4];
  wk1i = w[5];
  wk3r = w[6];
  wk3i = -w[7];
  wk2r = w[8];
  wk2i = w[9];
  x1r = a[0] - a[17];
  x1i = a[1] + a[16];
  x0r = a[8] - a[25];
  x0i = a[9] + a[24];
  x2r = wn4r * (x0r - x0i);
  x2i = wn4r * (x0i + x0r);
  y0r = x1r + x2r;
  y0i = x1i + x2i;
  y4r = x1r - x2r;
  y4i = x1i - x2i;
  x1r = a[0] + a[17];
  x1i = a[1] - a[16];
  x0r = a[8] + a[25];
  x0i = a[9] - a[24];
  x2r = wn4r * (x0r - x0i);
  x2i = wn4r * (x0i + x0r);
  y8r = x1r - x2i;
  y8i = x1i + x2r;
  y12r = x1r + x2i;
  y12i = x1i - x2r;
  x0r = a[2] - a[19];
  x0i = a[3] + a[18];
  x1r = wk1r * x0r - wk1i * x0i;
  x1i = wk1r * x0i + wk1i * x0r;
  x0r = a[10] - a[27];
  x0i = a[11] + a[26];
  x2r = wk3i * x0r - wk3r * x0i;
  x2i = wk3i * x0i + wk3r * x0r;
  y1r = x1r + x2r;
  y1i = x1i + x2i;
  y5r = x1r - x2r;
  y5i = x1i - x2i;
  x0r = a[2] + a[19];
  x0i = a[3] - a[18];
  x1r = wk3r * x0r - wk3i * x0i;
  x1i = wk3r * x0i + wk3i * x0r;
  x0r = a[10] + a[27];
  x0i = a[11] - a[26];
  x2r = wk1r * x0r + wk1i * x0i;
  x2i = wk1r * x0i - wk1i * x0r;
  y9r = x1r - x2r;
  y9i = x1i - x2i;
  y13r = x1r + x2r;
  y13i = x1i + x2i;
  x0r = a[4] - a[21];
  x0i = a[5] + a[20];
  x1r = wk2r * x0r - wk2i * x0i;
  x1i = wk2r * x0i + wk2i * x0r;
  x0r = a[12] - a[29];
  x0i = a[13] + a[28];
  x2r = wk2i * x0r - wk2r * x0i;
  x2i = wk2i * x0i + wk2r * x0r;
  y2r = x1r + x2r;
  y2i = x1i + x2i;
  y6r = x1r - x2r;
  y6i = x1i - x2i;
  x0r = a[4] + a[21];
  x0i = a[5] - a[20];
  x1r = wk2i * x0r - wk2r * x0i;
  x1i = wk2i * x0i + wk2r * x0r;
  x0r = a[12] + a[29];
  x0i = a[13] - a[28];
  x2r = wk2r * x0r - wk2i * x0i;
  x2i = wk2r * x0i + wk2i * x0r;
  y10r = x1r - x2r;
  y10i = x1i - x2i;
  y14r = x1r + x2r;
  y14i = x1i + x2i;
  x0r = a[6] - a[23];
  x0i = a[7] + a[22];
  x1r = wk3r * x0r - wk3i * x0i;
  x1i = wk3r * x0i + wk3i * x0r;
  x0r = a[14] - a[31];
  x0i = a[15] + a[30];
  x2r = wk1i * x0r - wk1r * x0i;
  x2i = wk1i * x0i + wk1r * x0r;
  y3r = x1r + x2r;
  y3i = x1i + x2i;
  y7r = x1r - x2r;
  y7i = x1i - x2i;
  x0r = a[6] + a[23];
  x0i = a[7] - a[22];
  x1r = wk1i * x0r + wk1r * x0i;
  x1i = wk1i * x0i - wk1r * x0r;
  x0r = a[14] + a[31];
  x0i = a[15] - a[30];
  x2r = wk3i * x0r - wk3r * x0i;
  x2i = wk3i * x0i + wk3r * x0r;
  y11r = x1r + x2r;
  y11i = x1i + x2i;
  y15r = x1r - x2r;
  y15i = x1i - x2i;
  x1r = y0r + y2r;
  x1i = y0i + y2i;
  x2r = y1r + y3r;
  x2i = y1i + y3i;
  a[0] = x1r + x2r;
  a[1] = x1i + x2i;
  a[2] = x1r - x2r;
  a[3] = x1i - x2i;
  x1r = y0r - y2r;
  x1i = y0i - y2i;
  x2r = y1r - y3r;
  x2i = y1i - y3i;
  a[4] = x1r - x2i;
  a[5] = x1i + x2r;
  a[6] = x1r + x2i;
  a[7] = x1i - x2r;
  x1r = y4r - y6i;
  x1i = y4i + y6r;
  x0r = y5r - y7i;
  x0i = y5i + y7r;
  x2r = wn4r * (x0r - x0i);
  x2i = wn4r * (x0i + x0r);
  a[8] = x1r + x2r;
  a[9] = x1i + x2i;
  a[10] = x1r - x2r;
  a[11] = x1i - x2i;
  x1r = y4r + y6i;
  x1i = y4i - y6r;
  x0r = y5r + y7i;
  x0i = y5i - y7r;
  x2r = wn4r * (x0r - x0i);
  x2i = wn4r * (x0i + x0r);
  a[12] = x1r - x2i;
  a[13] = x1i + x2r;
  a[14] = x1r + x2i;
  a[15] = x1i - x2r;
  x1r = y8r + y10r;
  x1i = y8i + y10i;
  x2r = y9r - y11r;
  x2i = y9i - y11i;
  a[16] = x1r + x2r;
  a[17] = x1i + x2i;
  a[18] = x1r - x2r;
  a[19] = x1i - x2i;
  x1r = y8r - y10r;
  x1i = y8i - y10i;
  x2r = y9r + y11r;
  x2i = y9i + y11i;
  a[20] = x1r - x2i;
  a[21] = x1i + x2r;
  a[22] = x1r + x2i;
  a[23] = x1i - x2r;
  x1r = y12r - y14i;
  x1i = y12i + y14r;
  x0r = y13r + y15i;
  x0i = y13i - y15r;
  x2r = wn4r * (x0r - x0i);
  x2i = wn4r * (x0i + x0r);
  a[24] = x1r + x2r;
  a[25] = x1i + x2i;
  a[26] = x1r - x2r;
  a[27] = x1i - x2i;
  x1r = y12r + y14i;
  x1i = y12i - y14r;
  x0r = y13r - y15i;
  x0i = y13i + y15r;
  x2r = wn4r * (x0r - x0i);
  x2i = wn4r * (x0i + x0r);
  a[28] = x1r - x2i;
  a[29] = x1i + x2r;
  a[30] = x1r + x2i;
  a[31] = x1i - x2r;
}